

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  void *in_R8;
  Mat local_68;
  
  iVar2 = -1;
  if (this->support_inplace == true) {
    Mat::clone(&local_68,(__fn *)bottom_blob,opt->blob_allocator,(int)opt,in_R8);
    if (&local_68 != top_blob) {
      if (local_68.refcount != (int *)0x0) {
        LOCK();
        *local_68.refcount = *local_68.refcount + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_68.data;
      top_blob->refcount = local_68.refcount;
      top_blob->elemsize = local_68.elemsize;
      top_blob->elempack = local_68.elempack;
      top_blob->allocator = local_68.allocator;
      top_blob->dims = local_68.dims;
      top_blob->w = local_68.w;
      top_blob->h = local_68.h;
      top_blob->d = local_68.d;
      top_blob->c = local_68.c;
      top_blob->cstep = local_68.cstep;
    }
    if (local_68.refcount != (int *)0x0) {
      LOCK();
      *local_68.refcount = *local_68.refcount + -1;
      UNLOCK();
      if (*local_68.refcount == 0) {
        if (local_68.allocator == (Allocator *)0x0) {
          if (local_68.data != (void *)0x0) {
            free(local_68.data);
          }
        }
        else {
          (*(local_68.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar2 = (*this->_vptr_Layer[9])(this,top_blob,opt);
    }
  }
  return iVar2;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}